

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_serialization.hpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::FunctionSerializer::FunctionDeserialize<duckdb::ScalarFunction>
          (FunctionSerializer *this,Deserializer *deserializer,ScalarFunction *function)

{
  pointer pcVar1;
  SerializationException *this_00;
  pointer *__ptr;
  anon_class_16_2_a14c9434 func;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (function->deserialize != (function_deserialize_t)0x0) {
    *(undefined8 *)this = 0;
    func.function = function;
    func.result = (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                   *)this;
    Deserializer::
    ReadObject<duckdb::FunctionSerializer::FunctionDeserialize<duckdb::ScalarFunction>(duckdb::Deserializer&,duckdb::ScalarFunction&)::_lambda(duckdb::Deserializer&)_1_>
              (deserializer,0x1f8,"function_data",func);
    return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
           (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
  }
  this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "Function requires deserialization but no deserialization function for %s","");
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  pcVar1 = (function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name._M_dataplus
           ._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,
             pcVar1 + (function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name.
                      _M_string_length);
  SerializationException::SerializationException<std::__cxx11::string>(this_00,&local_68,&local_48);
  __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static unique_ptr<FunctionData> FunctionDeserialize(Deserializer &deserializer, FUNC &function) {
		if (!function.deserialize) {
			throw SerializationException("Function requires deserialization but no deserialization function for %s",
			                             function.name);
		}
		unique_ptr<FunctionData> result;
		deserializer.ReadObject(504, "function_data",
		                        [&](Deserializer &obj) { result = function.deserialize(obj, function); });
		return result;
	}